

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::replace_illegal_entry_point_names(CompilerMSL *this)

{
  undefined8 in_RAX;
  const_iterator cVar1;
  mapped_type *pmVar2;
  _Hash_node_base *p_Var3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  get_illegal_func_names_abi_cxx11_();
  p_Var3 = (this->super_CompilerGLSL).super_Compiler.ir.entry_points._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      cVar1 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_._M_h,
                     (key_type *)(p_Var3 + 3));
      if (cVar1.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        ::std::__cxx11::string::append((char *)(p_Var3 + 3));
      }
      uStack_38 = CONCAT44(*(undefined4 *)&p_Var3[1]._M_nxt,(undefined4)uStack_38);
      pmVar2 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                            (key_type *)((long)&uStack_38 + 4));
      ::std::__cxx11::string::_M_assign((string *)pmVar2);
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void CompilerMSL::replace_illegal_entry_point_names()
{
	auto &illegal_func_names = get_illegal_func_names();

	// It is important to this before we fixup identifiers,
	// since if ep_name is reserved, we will need to fix that up,
	// and then copy alias back into entry.name after the fixup.
	for (auto &entry : ir.entry_points)
	{
		// Change both the entry point name and the alias, to keep them synced.
		string &ep_name = entry.second.name;
		if (illegal_func_names.find(ep_name) != end(illegal_func_names))
			ep_name += "0";

		ir.meta[entry.first].decoration.alias = ep_name;
	}
}